

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhsum.c
# Opt level: O0

Multihash XSUM_hashStream(FILE *inFile,AlgoSelected hashType,void *buffer,size_t blockSize)

{
  Multihash MVar1;
  int iVar2;
  size_t sVar3;
  XXH64_hash_t XVar4;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  FILE *in_RDI;
  XXH128_hash_t XVar5;
  size_t readSize;
  XXH3_state_t state128;
  XXH64_state_t state64;
  XXH32_state_t state32;
  Multihash finalHash;
  XXH3_state_t *in_stack_fffffffffffffc40;
  XXH3_state_t *in_stack_fffffffffffffc48;
  XXH64_state_t *state;
  undefined1 in_stack_fffffffffffffc68 [16];
  XXH32_state_t *in_stack_fffffffffffffc78;
  XXH64_hash_t in_stack_fffffffffffffc90;
  XXH3_state_t *in_stack_fffffffffffffc98;
  XXH32_state_t *in_stack_fffffffffffffca0;
  size_t in_stack_fffffffffffffcb0;
  void *in_stack_fffffffffffffcb8;
  XXH64_state_t *in_stack_fffffffffffffcc0;
  XXH32_hash_t local_60;
  undefined4 uStack_5c;
  XXH64_hash_t XStack_58;
  
  XXH32_reset(in_stack_fffffffffffffc78,in_stack_fffffffffffffc68._12_4_);
  XXH64_reset((XXH64_state_t *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  XXH3_128bits_reset(in_stack_fffffffffffffc40);
  while( true ) {
    sVar3 = fread(in_RDX,1,in_RCX,in_RDI);
    state = in_stack_fffffffffffffc68._0_8_;
    if (sVar3 == 0) break;
    if (in_ESI == 0) {
      XXH32_update(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
    }
    else if (in_ESI == 1) {
      XXH64_update(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    }
    else if (in_ESI == 2) {
      XXH3_128bits_update(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,0x104cdb);
    }
  }
  iVar2 = ferror(in_RDI);
  if (iVar2 == 0) {
    local_60 = 0;
    uStack_5c = 0;
    XStack_58 = 0;
    if (in_ESI == 0) {
      local_60 = XXH32_digest((XXH32_state_t *)in_stack_fffffffffffffc48);
    }
    else if (in_ESI == 1) {
      XVar4 = XXH64_digest(state);
      local_60 = (XXH32_hash_t)XVar4;
      uStack_5c = (undefined4)(XVar4 >> 0x20);
    }
    else if (in_ESI == 2) {
      XVar5 = XXH3_128bits_digest(in_stack_fffffffffffffc98);
      local_60 = (XXH32_hash_t)XVar5.low64;
      uStack_5c = XVar5.low64._4_4_;
      XStack_58 = XVar5.high64;
    }
    MVar1.xxh64._4_4_ = uStack_5c;
    MVar1.xxh32 = local_60;
    MVar1.xxh128.high64 = XStack_58;
    return MVar1;
  }
  XSUM_log("Error: a failure occurred reading the input file.\n");
  exit(1);
}

Assistant:

static Multihash
XSUM_hashStream(FILE* inFile,
                AlgoSelected hashType,
                void* buffer, size_t blockSize)
{
    XXH32_state_t state32;
    XXH64_state_t state64;
    XXH3_state_t state128;

    /* Init */
    (void)XXH32_reset(&state32, XXHSUM32_DEFAULT_SEED);
    (void)XXH64_reset(&state64, XXHSUM64_DEFAULT_SEED);
    (void)XXH3_128bits_reset(&state128);

    /* Load file & update hash */
    {   size_t readSize;
        while ((readSize = fread(buffer, 1, blockSize, inFile)) > 0) {
            switch(hashType)
            {
            case algo_xxh32:
                (void)XXH32_update(&state32, buffer, readSize);
                break;
            case algo_xxh64:
                (void)XXH64_update(&state64, buffer, readSize);
                break;
            case algo_xxh128:
                (void)XXH3_128bits_update(&state128, buffer, readSize);
                break;
            default:
                assert(0);
            }
        }
        if (ferror(inFile)) {
            XSUM_log("Error: a failure occurred reading the input file.\n");
            exit(1);
    }   }

    {   Multihash finalHash = {0};
        switch(hashType)
        {
        case algo_xxh32:
            finalHash.xxh32 = XXH32_digest(&state32);
            break;
        case algo_xxh64:
            finalHash.xxh64 = XXH64_digest(&state64);
            break;
        case algo_xxh128:
            finalHash.xxh128 = XXH3_128bits_digest(&state128);
            break;
        default:
            assert(0);
        }
        return finalHash;
    }
}